

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O0

void __thiscall jrtplib::RTPUDPv6Transmitter::~RTPUDPv6Transmitter(RTPUDPv6Transmitter *this)

{
  RTPUDPv6Transmitter *this_local;
  
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPUDPv6Transmitter_00192218;
  (*(this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject[4])();
  RTPAbortDescriptors::~RTPAbortDescriptors(&this->m_abortDesc);
  RTPKeyHashTable<const_in6_addr,_jrtplib::RTPUDPv6Transmitter::PortInfo_*,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>
  ::~RTPKeyHashTable(&this->acceptignoreinfo);
  std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::~list
            (&this->rawpacketlist);
  RTPHashTable<const_in6_addr,_jrtplib::RTPUDPv6Trans_GetHashIndex_in6_addr,_8317>::~RTPHashTable
            (&this->multicastgroups);
  RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
  ::~RTPHashTable(&this->destinations);
  std::__cxx11::list<in6_addr,_std::allocator<in6_addr>_>::~list(&this->localIPs);
  RTPTransmitter::~RTPTransmitter(&this->super_RTPTransmitter);
  return;
}

Assistant:

RTPUDPv6Transmitter::~RTPUDPv6Transmitter()
{
	Destroy();
}